

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_def.c
# Opt level: O0

char * upb_FileDef_EditionName(int edition)

{
  char *pcStack_10;
  int edition_local;
  
  if (edition == 0x3e6) {
    pcStack_10 = "PROTO2";
  }
  else if (edition == 999) {
    pcStack_10 = "PROTO3";
  }
  else if (edition == 1000) {
    pcStack_10 = "2023";
  }
  else {
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

UPB_API const char* upb_FileDef_EditionName(int edition) {
  // TODO Synchronize this with descriptor.proto better.
  switch (edition) {
    case UPB_DESC(EDITION_PROTO2):
      return "PROTO2";
    case UPB_DESC(EDITION_PROTO3):
      return "PROTO3";
    case UPB_DESC(EDITION_2023):
      return "2023";
    default:
      return "UNKNOWN";
  }
}